

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preEnd__constant____gles_texture_constant_type
          (ColladaParserAutoGen15Private *this)

{
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preEnd__constant____gles_texture_constant_type()
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateEnd__constant____gles_texture_constant_type();
        if ( !validationResult ) return false;

    } // validation
#endif

    return true;
}